

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::
emplace<QFileDialogPrivate::HistoryItem>
          (QGenericArrayOps<QFileDialogPrivate::HistoryItem> *this,qsizetype i,HistoryItem *args)

{
  HistoryItem **ppHVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_a8;
  HistoryItem local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size == i) {
      qVar4 = QArrayDataPointer<QFileDialogPrivate::HistoryItem>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>);
      if (qVar4 == 0) goto LAB_004ab95b;
      QFileDialogPrivate::HistoryItem::HistoryItem
                ((this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr +
                 (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size,args);
LAB_004aba6c:
      pqVar2 = &(this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_004aba25;
    }
LAB_004ab95b:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QFileDialogPrivate::HistoryItem>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>);
      if (qVar4 != 0) {
        QFileDialogPrivate::HistoryItem::HistoryItem
                  ((this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr + -1,args);
        ppHVar1 = &(this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr;
        *ppHVar1 = *ppHVar1 + -1;
        goto LAB_004aba6c;
      }
    }
  }
  local_58.selection.d.ptr = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.selection.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.selection.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.path.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.path.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialogPrivate::HistoryItem::HistoryItem(&local_58,args);
  bVar5 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size != 0;
  QArrayDataPointer<QFileDialogPrivate::HistoryItem>::detachAndGrow
            (&this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>,(uint)(i == 0 && bVar5)
             ,1,(HistoryItem **)0x0,(QArrayDataPointer<QFileDialogPrivate::HistoryItem> *)0x0);
  if (i == 0 && bVar5) {
    QFileDialogPrivate::HistoryItem::HistoryItem
              ((this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr + -1,&local_58);
    ppHVar1 = &(this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr;
    *ppHVar1 = *ppHVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_a8.sourceCopyConstruct = 0;
    local_a8.nSource = 0;
    local_a8.move = 0;
    local_a8.sourceCopyAssign = 0;
    local_a8.end = (HistoryItem *)0x0;
    local_a8.last = (HistoryItem *)0x0;
    local_a8.where = (HistoryItem *)0x0;
    local_a8.begin = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr;
    local_a8.size = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
    local_a8.data = &this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>;
    Inserter::insertOne(&local_a8,i,&local_58);
    (local_a8.data)->ptr = local_a8.begin;
    (local_a8.data)->size = local_a8.size;
  }
  QFileDialogPrivate::HistoryItem::~HistoryItem(&local_58);
LAB_004aba25:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }